

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_glows.cxx
# Opt level: O0

void __thiscall xray_re::xr_glow_object::load(xr_glow_object *this,xr_reader *r)

{
  xr_reader *this_00;
  size_t sVar1;
  fvector3 *v;
  float fVar2;
  unsigned_short local_1a;
  xr_reader *pxStack_18;
  uint16_t version;
  xr_reader *r_local;
  xr_glow_object *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  sVar1 = xr_reader::r_chunk<unsigned_short>(r,0xc411,&local_1a);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_glows.cxx"
                  ,0x12,"virtual void xray_re::xr_glow_object::load(xr_reader &)");
  }
  if (local_1a != 0x11 && local_1a != 0x12) {
    __assert_fail("version == GLOW_VERSION_17 || version == GLOW_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_glows.cxx"
                  ,0x13,"virtual void xray_re::xr_glow_object::load(xr_reader &)");
  }
  xr_custom_object::load(&this->super_xr_custom_object,pxStack_18);
  sVar1 = xr_reader::find_chunk(pxStack_18,0xc414);
  if (sVar1 != 0) {
    xr_reader::r_sz(pxStack_18,&this->m_shader);
    xr_reader::debug_find_chunk(pxStack_18);
  }
  sVar1 = xr_reader::find_chunk(pxStack_18,0xc415);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_glows.cxx"
                  ,0x1d,"virtual void xray_re::xr_glow_object::load(xr_reader &)");
  }
  xr_reader::r_sz(pxStack_18,&this->m_texture);
  xr_reader::debug_find_chunk(pxStack_18);
  sVar1 = xr_reader::find_chunk(pxStack_18,0xc413);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_glows.cxx"
                  ,0x22,"virtual void xray_re::xr_glow_object::load(xr_reader &)");
  }
  fVar2 = xr_reader::r_float(pxStack_18);
  this_00 = pxStack_18;
  this->m_radius = fVar2;
  if (local_1a == 0x11) {
    v = xr_custom_object::co_position(&this->super_xr_custom_object);
    xr_reader::r_fvector3(this_00,v);
  }
  xr_reader::debug_find_chunk(pxStack_18);
  xr_reader::r_chunk<unsigned_short>(pxStack_18,0xc416,&this->m_flags);
  return;
}

Assistant:

void xr_glow_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(GLOW_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == GLOW_VERSION_17 || version == GLOW_VERSION);

	xr_custom_object::load(r);

	if (r.find_chunk(GLOW_CHUNK_SHADER)) {
		r.r_sz(m_shader);
		r.debug_find_chunk();
	}

	if (!r.find_chunk(GLOW_CHUNK_TEXTURE))
		xr_not_expected();
	r.r_sz(m_texture);
	r.debug_find_chunk();

	if (!r.find_chunk(GLOW_CHUNK_PARAMS))
		xr_not_expected();
	m_radius = r.r_float();
	if (version == GLOW_VERSION_17)
		r.r_fvector3(co_position());
	r.debug_find_chunk();

	r.r_chunk<uint16_t>(GLOW_CHUNK_FLAGS, m_flags);
}